

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O2

void pzgeom::TPZArc3D::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double *pdVar1;
  int iVar2;
  TPZGeoNode *this;
  TPZGeoElRefPattern<pzgeom::TPZArc3D> *this_00;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  double local_f0;
  TPZManVector<long,_3> indexes;
  TPZManVector<double,_3> cods;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  puVar5 = &local_78;
  uStack_70 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_38 = 0;
  local_78 = 0x3ff0000000000000;
  local_58 = 0x3ff0000000000000;
  local_48 = 0x3fe6a09e667f3bcd;
  uStack_40 = 0x3fe6a09e667f3bcd;
  pdVar1 = size->fStore;
  *pdVar1 = 1.0;
  pdVar1[1] = 1.0;
  TPZManVector<long,_3>::TPZManVector(&indexes,3);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    local_f0 = 0.0;
    TPZManVector<double,_3>::TPZManVector(&cods,3,&local_f0);
    pdVar1 = lowercorner->fStore;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      cods.super_TPZVec<double>.fStore[lVar3] = pdVar1[lVar3] + (double)puVar5[lVar3];
    }
    iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    indexes.super_TPZVec<long>.fStore[lVar4] = (long)iVar2;
    this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar2);
    TPZGeoNode::Initialize(this,&cods.super_TPZVec<double>,gmesh);
    TPZManVector<double,_3>::~TPZManVector(&cods);
    puVar5 = puVar5 + 3;
  }
  this_00 = (TPZGeoElRefPattern<pzgeom::TPZArc3D> *)operator_new(800);
  TPZGeoElRefPattern<pzgeom::TPZArc3D>::TPZGeoElRefPattern
            (this_00,&indexes.super_TPZVec<long>,matid,gmesh);
  TPZManVector<long,_3>::~TPZManVector(&indexes);
  return;
}

Assistant:

void TPZArc3D::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    REAL coords[3][3] = {
        {1,0,0},
        {0,1,0},
        {M_SQRT1_2,M_SQRT1_2,0}
    };
    size[0] = 1.;
    size[1] = 1.;
    
    TPZManVector<int64_t,3> indexes(3);
    for (int i=0; i<3; i++) {
        TPZManVector<REAL,3> cods(3,0.);
        for (int j=0; j<3; j++) {
            cods[j] = lowercorner[j]+coords[i][j];
        }
        indexes[i] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[indexes[i]].Initialize(cods, gmesh);
    }
    TPZGeoElRefPattern<TPZArc3D> *gel = new TPZGeoElRefPattern<TPZArc3D>(indexes,matid,gmesh);
}